

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O0

void __thiscall
ExecutorRegVm::ExecCheckedReturn(ExecutorRegVm *this,uint typeId,RegVmRegister *regFilePtr)

{
  anon_union_8_3_3250f155_for_RegVmRegister_0 aVar1;
  long lVar2;
  uint *target;
  uint uVar3;
  ExternTypeInfo *pEVar4;
  anon_union_8_3_3250f155_for_RegVmRegister_0 __src;
  ExternTypeInfo *pEVar5;
  char *pcVar6;
  char *copy_1;
  uint objSize;
  char *copy;
  uint length;
  void *ptr;
  char *returnValuePtr;
  ExternTypeInfo *type;
  uintptr_t frameEnd;
  uintptr_t frameBase;
  RegVmRegister *regFilePtr_local;
  uint typeId_local;
  ExecutorRegVm *this_local;
  
  aVar1 = regFilePtr[1].field_0;
  lVar2 = (regFilePtr->field_0).longValue;
  uVar3 = FastVector<char,_true,_true>::size(&this->dataStack);
  pEVar4 = FastVector<ExternTypeInfo,_false,_false>::operator[](&this->exLinker->exTypes,typeId);
  target = this->tempStackArrayBase;
  __src = (anon_union_8_3_3250f155_for_RegVmRegister_0)
          anon_unknown.dwarf_405be::vmLoadPointer(target);
  if (((ulong)aVar1 <= (ulong)__src) && ((ulong)__src <= lVar2 + (ulong)uVar3)) {
    NULLC::SetCollectMemory(false);
    if ((pEVar4->field_8).arrSize == 0xffffffff) {
      uVar3 = target[2];
      pEVar5 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         (&this->exLinker->exTypes,(pEVar4->field_11).subType);
      pcVar6 = (char *)NULLC::AllocObject(pEVar5->size * uVar3,(pEVar4->field_11).subType);
      pEVar4 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         (&this->exLinker->exTypes,(pEVar4->field_11).subType);
      memcpy(pcVar6,(void *)__src,(ulong)(pEVar4->size * uVar3));
      anon_unknown.dwarf_405be::vmStorePointer(target,pcVar6);
    }
    else {
      uVar3 = pEVar4->size;
      pcVar6 = (char *)NULLC::AllocObject(uVar3,typeId);
      memcpy(pcVar6,(void *)__src,(ulong)uVar3);
      anon_unknown.dwarf_405be::vmStorePointer(target,pcVar6);
    }
    NULLC::SetCollectMemory(true);
  }
  return;
}

Assistant:

void ExecutorRegVm::ExecCheckedReturn(unsigned typeId, RegVmRegister * const regFilePtr)
{
	uintptr_t frameBase = regFilePtr[rvrrFrame].ptrValue;
	uintptr_t frameEnd = regFilePtr[rvrrGlobals].ptrValue + dataStack.size();

	ExternTypeInfo &type = exLinker->exTypes[typeId];

	char *returnValuePtr = (char*)tempStackArrayBase;

	void *ptr = vmLoadPointer(returnValuePtr);

	if(uintptr_t(ptr) >= frameBase && uintptr_t(ptr) <= frameEnd)
	{
		// Don't want to trigger GC at this point
		NULLC::SetCollectMemory(false);

		if(type.arrSize == ~0u)
		{
			unsigned length = *(int*)(returnValuePtr + sizeof(void*));

			char *copy = (char*)NULLC::AllocObject(exLinker->exTypes[type.subType].size * length, type.subType);
			memcpy(copy, ptr, unsigned(exLinker->exTypes[type.subType].size * length));
			vmStorePointer(returnValuePtr, copy);
		}
		else
		{
			unsigned objSize = type.size;

			char *copy = (char*)NULLC::AllocObject(objSize, typeId);
			memcpy(copy, ptr, objSize);
			vmStorePointer(returnValuePtr, copy);
		}

		NULLC::SetCollectMemory(true);
	}
}